

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestHangingTailCallee::foo(TestHangingTailCallee *this,FooContext context)

{
  Type local_40;
  undefined1 local_38 [16];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>
  local_28;
  TestHangingTailCallee *this_local;
  FooContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_28.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_2
        )context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&local_28);
  local_40.cancelCount = (int *)context.hook[2]._vptr_CallContextHook;
  kj::
  defer<capnp::_::(anonymous_namespace)::TestHangingTailCallee::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>
            ((kj *)local_38,&local_40);
  kj::Promise<void>::
  attach<kj::_::Deferred<capnp::_::(anonymous_namespace)::TestHangingTailCallee::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>>
            ((Promise<void> *)this,&local_28);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:969:27)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>
               *)local_38);
  kj::Promise<void>::~Promise((Promise<void> *)&local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> foo(FooContext context) override {
    ++callCount;
    return kj::Promise<void>(kj::NEVER_DONE)
        .attach(kj::defer([&cancelCount = cancelCount]() { ++cancelCount; }));
  }